

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_fax3.c
# Opt level: O3

int Fax3PreEncode(TIFF *tif,uint16_t s)

{
  uint8_t *puVar1;
  int iVar2;
  int iVar3;
  float fVar4;
  
  puVar1 = tif->tif_data;
  if (puVar1 != (uint8_t *)0x0) {
    puVar1[0x48] = '\0';
    puVar1[0x49] = '\0';
    puVar1[0x4a] = '\0';
    puVar1[0x4b] = '\0';
    puVar1[0x4c] = '\b';
    puVar1[0x4d] = '\0';
    puVar1[0x4e] = '\0';
    puVar1[0x4f] = '\0';
    puVar1[0x80] = '\0';
    puVar1[0x81] = '\0';
    puVar1[0x82] = '\0';
    puVar1[0x83] = '\0';
    if (*(void **)(puVar1 + 0x88) != (void *)0x0) {
      _TIFFmemset(*(void **)(puVar1 + 0x88),0,*(tmsize_t *)(puVar1 + 8));
    }
    iVar2 = 0;
    iVar3 = 0;
    if ((puVar1[0x20] & 1) != 0) {
      fVar4 = (tif->tif_dir).td_yresolution;
      if ((tif->tif_dir).td_resolutionunit == 3) {
        fVar4 = fVar4 * 2.54;
      }
      iVar2 = (uint)(150.0 < fVar4) * 2 + 2;
      iVar3 = (uint)(150.0 < fVar4) * 2 + 1;
    }
    *(int *)(puVar1 + 0x94) = iVar2;
    *(int *)(puVar1 + 0x90) = iVar3;
    puVar1[0x98] = '\0';
    puVar1[0x99] = '\0';
    puVar1[0x9a] = '\0';
    puVar1[0x9b] = '\0';
    return 1;
  }
  __assert_fail("sp != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_fax3.c"
                ,0x308,"int Fax3PreEncode(TIFF *, uint16_t)");
}

Assistant:

static int Fax3PreEncode(TIFF *tif, uint16_t s)
{
    Fax3CodecState *sp = EncoderState(tif);

    (void)s;
    assert(sp != NULL);
    sp->bit = 8;
    sp->data = 0;
    sp->tag = G3_1D;
    /*
     * This is necessary for Group 4; otherwise it isn't
     * needed because the first scanline of each strip ends
     * up being copied into the refline.
     */
    if (sp->refline)
        _TIFFmemset(sp->refline, 0x00, sp->b.rowbytes);
    if (is2DEncoding(sp))
    {
        float res = tif->tif_dir.td_yresolution;
        /*
         * The CCITT spec says that when doing 2d encoding, you
         * should only do it on K consecutive scanlines, where K
         * depends on the resolution of the image being encoded
         * (2 for <= 200 lpi, 4 for > 200 lpi).  Since the directory
         * code initializes td_yresolution to 0, this code will
         * select a K of 2 unless the YResolution tag is set
         * appropriately.  (Note also that we fudge a little here
         * and use 150 lpi to avoid problems with units conversion.)
         */
        if (tif->tif_dir.td_resolutionunit == RESUNIT_CENTIMETER)
            res *= 2.54f; /* convert to inches */
        sp->maxk = (res > 150 ? 4 : 2);
        sp->k = sp->maxk - 1;
    }
    else
        sp->k = sp->maxk = 0;
    sp->line = 0;
    return (1);
}